

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic-ops.h
# Opt level: O0

int cmpxchgi(int *ptr,int oldval,int newval)

{
  int iVar1;
  int out;
  int newval_local;
  int oldval_local;
  int *ptr_local;
  
  LOCK();
  iVar1 = *ptr;
  if (oldval == iVar1) {
    *ptr = newval;
    iVar1 = oldval;
  }
  UNLOCK();
  return iVar1;
}

Assistant:

UV_UNUSED(static int cmpxchgi(int* ptr, int oldval, int newval)) {
#if defined(__i386__) || defined(__x86_64__)
  int out;
  __asm__ __volatile__ ("lock; cmpxchg %2, %1;"
                        : "=a" (out), "+m" (*(volatile int*) ptr)
                        : "r" (newval), "0" (oldval)
                        : "memory");
  return out;
#elif defined(_AIX) && defined(__xlC__)
  const int out = (*(volatile int*) ptr);
  __compare_and_swap(ptr, &oldval, newval);
  return out;
#elif defined(__MVS__)
  unsigned int op4;
  if (__plo_CSST(ptr, (unsigned int*) &oldval, newval,
                (unsigned int*) ptr, *ptr, &op4))
    return oldval;
  else
    return op4;
#else
  return __sync_val_compare_and_swap(ptr, oldval, newval);
#endif
}